

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen14PrivateFindElementHash.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL14::ColladaParserAutoGen14Private::isDifferentNamespaceAllowed
          (ColladaParserAutoGen14Private *this)

{
  bool bVar1;
  reference pvVar2;
  deque<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
  *in_RDI;
  bool local_1;
  
  bVar1 = std::
          deque<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
          ::empty((deque<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
                   *)0xbb15cc);
  if (bVar1) {
    local_1 = true;
  }
  else {
    pvVar2 = std::
             deque<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
             ::back(in_RDI);
    if (pvVar2->typeID == 0x15) {
      local_1 = true;
    }
    else if (pvVar2->typeID == 0x13c) {
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool ColladaParserAutoGen14Private::isDifferentNamespaceAllowed()
{
    if ( mElementDataStack.empty() )
        return true;

    switch ( mElementDataStack.back().typeID )
    {
    // fx_profile_abstract
    case 21:
        return true;
    // technique
    case 316:
        return true;
    }
    return false;
}